

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O0

int tidyReportDoctype(TidyDoc tdoc)

{
  TidyDocImpl *impl;
  int iret;
  TidyDoc tdoc_local;
  
  impl._4_4_ = -0x16;
  if (tdoc != (TidyDoc)0x0) {
    tidyDocReportDoctype((TidyDocImpl *)tdoc);
    impl._4_4_ = 0;
  }
  return impl._4_4_;
}

Assistant:

int TIDY_CALL        tidyReportDoctype( TidyDoc tdoc )
{
    int iret = -EINVAL;
    TidyDocImpl* impl = tidyDocToImpl( tdoc );
    if ( impl ) {
      tidyDocReportDoctype( impl );
      iret = 0;
    }
    return iret;
}